

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  __int_type_conflict3 _Var4;
  __pointer_type pSVar5;
  bool bVar6;
  uint uVar7;
  void *pvVar8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar9;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar10;
  Rep *pRVar11;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar12;
  string *psVar13;
  string *s;
  ulong uVar14;
  uint *puVar15;
  uint uVar16;
  undefined8 extraout_RDX;
  undefined8 uVar17;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  uint64_t *puVar18;
  ushort *puVar19;
  ushort *puVar20;
  ulong uVar21;
  Arena *pAVar22;
  uint64_t uVar23;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar24;
  uint uVar25;
  ushort *puVar26;
  undefined1 auVar27 [16];
  pair<const_char_*,_unsigned_int> pVar28;
  string_view wire_bytes;
  string_view wire_bytes_00;
  LogMessageFatal local_40 [16];
  SerialArena *this_00;
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  uVar7 = data.field_0._0_4_;
  if ((uVar7 & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_002a6620;
  }
  uVar3 = *(ushort *)(table_00.data + 10);
  uVar25 = uVar3 & 0x1c0;
  this_00 = (SerialArena *)(ulong)uVar25;
  puVar19 = (ushort *)0x1;
  uVar23 = hasbits;
  pvVar8 = MaybeGetSplitBase(msg,true,table);
  if (uVar25 != 0x100) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x8f1);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_40,0x21,"Unsupported repeated string rep: ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_40,(unsigned_short)uVar25);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  puVar18 = (uint64_t *)((long)pvVar8 + (ulong)*(uint *)table_00);
  if (((ulong)puVar18 & 7) != 0) {
    AlignFail(puVar18);
  }
  uVar25 = uVar3 & 0x600;
  if ((undefined1 *)*puVar18 == kZeroBuffer) {
    pAVar22 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar22 & 1) != 0) {
      pAVar22 = *(Arena **)((ulong)pAVar22 & 0xfffffffffffffffe);
    }
    pRVar9 = Arena::CreateArenaCompatible<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                       (pAVar22);
    *puVar18 = (uint64_t)pRVar9;
  }
  this.data = *puVar18;
  pAVar22 = *(Arena **)(this.data + 0x10);
  puVar26 = (ushort *)ptr;
  if (pAVar22 == (Arena *)0x0) {
LAB_002a67ec:
    do {
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this);
      puVar19 = puVar26;
      ptr = InlineGreedyStringParser(s,(char *)puVar26,ctx);
      ctx_00 = extraout_RDX_02;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_002a690b;
      puVar19 = (ushort *)(s->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)puVar19;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)s->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar25,(uint16_t)uVar23
                          );
      ctx_00 = extraout_RDX_03;
      if (!bVar6) goto LAB_002a690b;
      puVar19 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = ptr < puVar19;
      if (ptr < puVar19) {
        bVar1 = (byte)*(ushort *)ptr;
        this_00 = (SerialArena *)(ulong)bVar1;
        puVar26 = (ushort *)((long)ptr + 1);
        if ((char)bVar1 < '\0') {
          bVar2 = *(byte *)puVar26;
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
          uVar16 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          this_00 = (SerialArena *)(ulong)uVar16;
          if ((char)bVar2 < '\0') {
            pVar28 = ReadTagFallback(ptr,uVar16);
            puVar26 = (ushort *)pVar28.first;
            this_00 = (SerialArena *)(ulong)pVar28.second;
          }
          else {
            puVar26 = (ushort *)((long)ptr + 2);
          }
        }
      }
    } while ((ptr < puVar19) && ((uint)this_00 == uVar7));
  }
  else {
    auVar27 = __tls_get_addr(&PTR_004d49d0);
    uVar17 = auVar27._8_8_;
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(auVar27._0_8_ + 8))->data;
    if (data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)(pAVar22->impl_).tag_and_id_
       ) goto LAB_002a67ec;
    this_00 = *(SerialArena **)(auVar27._0_8_ + 0x10);
    data.field_0.data = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)this;
    if (((ulong)data.field_0 & 1) == 0) {
      pcVar10 = (char *)(ulong)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0)
      ;
    }
    else {
      pRVar11 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this);
      pcVar10 = (char *)(ulong)(uint)pRVar11->allocated_size;
      uVar17 = extraout_RDX;
    }
    pVar28._8_8_ = uVar17;
    pVar28.first = pcVar10;
    aVar24.data = this.data;
    if ((int)pcVar10 != *(int *)(this.data + 8)) goto LAB_002a67ec;
    do {
      bVar1 = (byte)*puVar26;
      puVar20 = (ushort *)(ulong)bVar1;
      uVar16 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar28 = (pair<const_char_*,_unsigned_int>)ReadSizeFallback((char *)puVar26,(uint)bVar1);
        puVar26 = (ushort *)pVar28.first;
        uVar16 = pVar28.second;
        puVar19 = puVar20;
      }
      else {
        puVar26 = (ushort *)((long)puVar26 + 1);
      }
      ctx_00 = pVar28._8_8_;
      if (puVar26 == (ushort *)0x0) {
        ptr = (char *)0x0;
      }
      else {
        _Var4 = (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var4 != 0) {
          uVar14 = _Var4 - 0x20;
          (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar14;
          pSVar5 = (this_00->string_block_)._M_b._M_p;
          uVar21 = (ulong)pSVar5->allocated_size_ - 0x10;
          if (uVar21 < uVar14) {
            psVar13 = absl::lts_20240722::log_internal::
                      MakeCheckOpString<unsigned_long,unsigned_long>
                                (uVar14,uVar21,"offset <= effective_size()");
          }
          else {
            psVar13 = (string *)0x0;
          }
          if (psVar13 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/string_block.h"
                       ,0xa2,*(undefined8 *)(psVar13 + 8),*(undefined8 *)psVar13);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
          }
          aVar24.data = (long)&pSVar5[-1].next_ + _Var4;
        }
        data.field_0 = aVar24;
        if (_Var4 == 0) {
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         SerialArena::AllocateFromStringBlockFallback(this_00);
        }
        *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
        *(undefined8 *)((long)data.field_0 + 8) = 0;
        *(undefined1 *)((long)data.field_0 + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse
                  ((RepeatedPtrFieldBase *)this,(void *)data.field_0);
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)puVar26,uVar16,
                         (string *)data.field_0);
        ctx_00 = extraout_RDX_00;
        puVar19 = puVar26;
      }
      if ((ushort *)ptr == (ushort *)0x0) {
LAB_002a690b:
        pcVar10 = Error(msg,(char *)puVar19,ctx_00,data,table,hasbits);
        return pcVar10;
      }
      pVVar12 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this,*(int *)(this.data + 8) + -1);
      puVar19 = (ushort *)(pVVar12->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)puVar19;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar6 = MpVerifyUtf8((TcParser *)pVVar12->_M_string_length,wire_bytes,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar25,(uint16_t)uVar23
                          );
      ctx_00 = extraout_RDX_01;
      if (!bVar6) goto LAB_002a690b;
      puVar26 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
      bVar6 = ptr < puVar26;
      if (puVar26 <= ptr) break;
      bVar1 = (byte)*(ushort *)ptr;
      pVar28.second._0_1_ = bVar1;
      pVar28.first = (char *)ctx;
      pVar28._9_7_ = 0;
      puVar26 = (ushort *)((long)ptr + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar26;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar16 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        pVar28 = (pair<const_char_*,_unsigned_int>)(ZEXT416(uVar16) << 0x40);
        if ((char)bVar2 < '\0') {
          puVar19 = (ushort *)(ulong)uVar16;
          pVar28 = ReadTagFallback(ptr,uVar16);
          puVar26 = (ushort *)pVar28.first;
        }
        else {
          puVar26 = (ushort *)((long)ptr + 2);
        }
      }
    } while (pVar28.second == uVar7);
  }
  if ((!bVar6) || ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr)) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar15 & 3) != 0) {
        AlignFail();
      }
      *puVar15 = *puVar15 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar7 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar14 = (ulong)(uVar7 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar14 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar14);
LAB_002a6620:
  pcVar10 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (PROTOBUF_PREDICT_TRUE(
              arena != nullptr &&
              arena->impl_.GetSerialArenaFast(&serial_arena) &&
              field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr ||
                                     !MpVerifyUtf8(field[field.size() - 1],
                                                   table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (PROTOBUF_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}